

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolutiondepthwise_x86_avx2.cpp
# Opt level: O0

int __thiscall
ncnn::ConvolutionDepthWise_x86_avx2::create_pipeline
          (ConvolutionDepthWise_x86_avx2 *this,Option *opt)

{
  ulong uVar1;
  Layer *pLVar2;
  long in_RSI;
  long *in_RDI;
  Mat weight_data_r2_3;
  Mat weight_data_r2;
  Mat weight_data_tmp_1;
  Mat weight_data_r2_2;
  Mat weight_data_tmp;
  Mat weight_data_r2_1;
  int elempack;
  int channels;
  int maxk;
  Option *in_stack_00000488;
  ConvolutionDepthWise_x86_avx2 *in_stack_00000490;
  int local_1f8;
  Option *in_stack_fffffffffffffe28;
  undefined4 in_stack_fffffffffffffe30;
  int in_stack_fffffffffffffe34;
  Mat *in_stack_fffffffffffffe38;
  int in_stack_fffffffffffffe40;
  int in_stack_fffffffffffffe44;
  Mat *in_stack_fffffffffffffe48;
  Option *in_stack_fffffffffffffe70;
  ConvolutionDepthWise_x86_avx2 *in_stack_fffffffffffffe78;
  Option *in_stack_fffffffffffffeb0;
  Mat *in_stack_fffffffffffffeb8;
  int in_stack_fffffffffffffec4;
  Mat local_b8 [2];
  int local_24;
  int local_20;
  int local_1c;
  long local_18;
  int local_4;
  
  if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x160) == 0) {
    local_18 = in_RSI;
    pLVar2 = create_activation_layer
                       (in_stack_fffffffffffffec4,in_stack_fffffffffffffeb8,
                        in_stack_fffffffffffffeb0);
    in_RDI[1] = (long)pLVar2;
    if (((*(byte *)(local_18 + 0x1e) & 1) == 0) ||
       (*(long *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x178) != 1)) {
      local_1c = *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4) *
                 *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd8);
      uVar1 = (long)*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x104) /
              (long)*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x108);
      local_20 = ((int)((long)((ulong)(uint)((int)uVar1 >> 0x1f) << 0x20 | uVar1 & 0xffffffff) /
                       (long)local_1c) /
                 (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0) /
                 *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x108))) *
                 *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x108);
      if ((local_20 == *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x108)) &&
         (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x108) ==
          *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0))) {
        local_24 = 1;
        if ((*(byte *)(local_18 + 0x27) & 1) != 0) {
          if (local_20 % 8 == 0) {
            local_1f8 = 8;
          }
          else {
            local_1f8 = 1;
            if (local_20 % 4 == 0) {
              local_1f8 = 4;
            }
          }
          local_24 = local_1f8;
        }
        if (local_24 == 8) {
          if (((((*(byte *)(local_18 + 0x2f) & 1) != 0) &&
               (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4) == 3)) &&
              (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd8) == 3)) &&
             (((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xdc) == 1 &&
               (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe0) == 1)) &&
              ((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe4) == 1 &&
               (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe8) == 1)))))) {
            Mat::reshape(in_stack_fffffffffffffe48,in_stack_fffffffffffffe44,
                         in_stack_fffffffffffffe40,(Allocator *)in_stack_fffffffffffffe38);
            Mat::Mat(local_b8);
            convert_packing((Mat *)CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
                            in_stack_fffffffffffffe38,in_stack_fffffffffffffe34,
                            in_stack_fffffffffffffe28);
            cast_float32_to_float16
                      ((Mat *)CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
                       in_stack_fffffffffffffe38,
                       (Option *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30));
            local_4 = 0;
            Mat::~Mat((Mat *)0x63c153);
            Mat::~Mat((Mat *)0x63c160);
            return local_4;
          }
          if ((((*(byte *)(local_18 + 0x2f) & 1) != 0) &&
              (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4) == 3)) &&
             ((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd8) == 3 &&
              ((((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xdc) == 1 &&
                 (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe0) == 1)) &&
                (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe4) == 2)) &&
               (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe8) == 2)))))) {
            Mat::reshape(in_stack_fffffffffffffe48,in_stack_fffffffffffffe44,
                         in_stack_fffffffffffffe40,(Allocator *)in_stack_fffffffffffffe38);
            Mat::Mat((Mat *)&stack0xfffffffffffffea8);
            convert_packing((Mat *)CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
                            in_stack_fffffffffffffe38,in_stack_fffffffffffffe34,
                            in_stack_fffffffffffffe28);
            cast_float32_to_float16
                      ((Mat *)CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
                       in_stack_fffffffffffffe38,
                       (Option *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30));
            local_4 = 0;
            Mat::~Mat((Mat *)0x63c2fb);
            Mat::~Mat((Mat *)0x63c308);
            return local_4;
          }
          Mat::reshape(in_stack_fffffffffffffe48,in_stack_fffffffffffffe44,in_stack_fffffffffffffe40
                       ,(Allocator *)in_stack_fffffffffffffe38);
          convert_packing((Mat *)CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
                          in_stack_fffffffffffffe38,in_stack_fffffffffffffe34,
                          in_stack_fffffffffffffe28);
          local_4 = 0;
          Mat::~Mat((Mat *)0x63c3c3);
          return local_4;
        }
        if (local_24 == 4) {
          Mat::reshape(in_stack_fffffffffffffe48,in_stack_fffffffffffffe44,in_stack_fffffffffffffe40
                       ,(Allocator *)in_stack_fffffffffffffe38);
          convert_packing((Mat *)CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
                          in_stack_fffffffffffffe38,in_stack_fffffffffffffe34,
                          in_stack_fffffffffffffe28);
          local_4 = 0;
          Mat::~Mat((Mat *)0x63c464);
          return local_4;
        }
        if (local_24 == 1) {
          if ((((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4) == 3) &&
               (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd8) == 3)) &&
              ((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xdc) == 1 &&
               ((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe0) == 1 &&
                (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe4) == 1)))))) &&
             (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe8) == 1)) {
            return 0;
          }
          if (((((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4) == 3) &&
                (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd8) == 3)) &&
               (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xdc) == 1)) &&
              ((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe0) == 1 &&
               (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe4) == 2)))) &&
             (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe8) == 2)) {
            return 0;
          }
        }
      }
      create_group_ops(in_stack_00000490,in_stack_00000488);
      local_4 = 0;
    }
    else {
      local_4 = create_pipeline_int8_x86(in_stack_fffffffffffffe78,in_stack_fffffffffffffe70);
    }
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int ConvolutionDepthWise_x86_avx2::create_pipeline(const Option& opt)
{
    if (dynamic_weight)
        return 0;

    activation = create_activation_layer(activation_type, activation_params, opt);

#if NCNN_INT8
    if (opt.use_int8_inference && weight_data.elemsize == (size_t)1u)
    {
        return create_pipeline_int8_x86(opt);
    }
#endif

    const int maxk = kernel_w * kernel_h;
    int channels = (weight_data_size / group) / maxk / (num_output / group) * group;

    // depth-wise
    if (channels == group && group == num_output)
    {
        int elempack = 1;
#if __SSE2__
        if (opt.use_packing_layout)
        {
#if __AVX__
            elempack = channels % 8 == 0 ? 8 : channels % 4 == 0 ? 4 : 1;
#else
            elempack = channels % 4 == 0 ? 4 : 1;
#endif
        }
#endif // __SSE2__

#if __SSE2__
#if __AVX__
        // pack8
        if (elempack == 8)
        {
#if __AVX2__
            if (opt.use_weight_fp16_storage && kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
            {
                Mat weight_data_r2 = weight_data.reshape(maxk, group);
                Mat weight_data_tmp;
                convert_packing(weight_data_r2, weight_data_tmp, 8, opt);
                ncnn::cast_float32_to_float16(weight_data_tmp, weight_data_packed, opt);
                return 0;
            }
            if (opt.use_weight_fp16_storage && kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
            {
                Mat weight_data_r2 = weight_data.reshape(maxk, group);
                Mat weight_data_tmp;
                convert_packing(weight_data_r2, weight_data_tmp, 8, opt);
                ncnn::cast_float32_to_float16(weight_data_tmp, weight_data_packed, opt);
                return 0;
            }
#endif
            Mat weight_data_r2 = weight_data.reshape(maxk, group);
            convert_packing(weight_data_r2, weight_data_packed, 8, opt);

            return 0;
        }
#endif // __AVX__

        // pack4
        if (elempack == 4)
        {
            Mat weight_data_r2 = weight_data.reshape(maxk, group);
            convert_packing(weight_data_r2, weight_data_packed, 4, opt);

            return 0;
        }
#endif // __SSE2__

        if (elempack == 1)
        {
            // depth-wise specific
            if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
            {
                return 0;
            }
            if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
            {
                return 0;
            }
        }
    }

    // group convolution
    create_group_ops(opt);

    return 0;
}